

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_ClearParticles(void)

{
  particle_t *ppVar1;
  WORD *pWVar2;
  long lVar3;
  
  lVar3 = 0;
  memset(Particles,0,(ulong)NumParticles << 7);
  ppVar1 = Particles;
  ActiveParticles = 0xffff;
  InactiveParticles = 0;
  if (1 < NumParticles) {
    pWVar2 = &Particles->tnext;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + 1;
      *pWVar2 = (WORD)lVar3;
      pWVar2 = pWVar2 + 0x40;
    } while (lVar3 < (long)((ulong)NumParticles - 1));
  }
  ppVar1[lVar3].tnext = 0xffff;
  return;
}

Assistant:

void P_ClearParticles ()
{
	int i;

	memset (Particles, 0, NumParticles * sizeof(particle_t));
	ActiveParticles = NO_PARTICLE;
	InactiveParticles = 0;
	for (i = 0; i < NumParticles-1; i++)
		Particles[i].tnext = i + 1;
	Particles[i].tnext = NO_PARTICLE;
}